

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thecl06.c
# Opt level: O2

thecl_t * th06_parse(FILE *in,char *filename,uint version)

{
  list_node_t *list;
  undefined8 *__ptr;
  int iVar1;
  list_node_t *plVar2;
  undefined1 local_b8 [72];
  int *local_70;
  undefined8 uStack_68;
  thecl_sub_t *local_60;
  thecl_t *local_58;
  path_state_t local_50;
  code *local_38;
  code *local_30;
  
  local_b8._0_4_ = 0;
  local_b8._4_4_ = 0xff;
  local_b8._8_4_ = 0;
  local_b8[0x10] = true;
  local_b8[0x11] = false;
  local_b8[0x12] = false;
  local_b8[0x13] = false;
  local_b8._12_4_ = version;
  list_init((list_t *)(local_b8 + 0x18));
  list_init((list_t *)(local_b8 + 0x28));
  list = (list_node_t *)(local_b8 + 0x38);
  list_init((list_t *)list);
  local_70 = (int *)0x0;
  uStack_68._0_4_ = 0;
  uStack_68._4_4_ = 0;
  local_60 = (thecl_sub_t *)0x0;
  local_58 = thecl_new();
  local_58->version = version;
  local_38 = th06_find_format;
  local_30 = th06_instr_size;
  path_init((path_state_t *)(local_b8 + 0x68),filename,argv0);
  thecl_yyin = in;
  iVar1 = thecl_yyparse((parser_state_t *)local_b8);
  if (iVar1 == 0) {
    path_free((path_state_t *)(local_b8 + 0x68));
    plVar2 = list;
    while (plVar2 = plVar2->next, plVar2 != (list_node_t *)0x0) {
      __ptr = (undefined8 *)plVar2->data;
      free((void *)*__ptr);
      free(__ptr);
    }
    list_free_nodes((list_t *)list);
    free(local_70);
  }
  else {
    local_58 = (thecl_t *)0x0;
  }
  return local_58;
}

Assistant:

static thecl_t*
th06_parse(
    FILE* in,
    char* filename,
    unsigned int version)
{
    parser_state_t state;

    state.instr_time = 0;
    state.instr_rank = 0xff;
    state.instr_flags = 0;
    state.version = version;
    state.uses_numbered_subs = true;
    state.has_overdrive_difficulty = false;
    state.uses_stack_offsets = false;
    state.has_numeric_difficulties = false;
    list_init(&state.expressions);
    list_init(&state.block_stack);
    list_init(&state.global_definitions);
    state.scope_stack = NULL;
    state.scope_cnt = 0;
    state.scope_id = 0;
    state.current_sub = NULL;
    state.ecl = thecl_new();
    state.ecl->version = version;
    state.instr_format = th06_find_format;
    state.instr_size = th06_instr_size;

    path_init(&state.path_state, filename, argv0);

    thecl_yyin = in;

    if (thecl_yyparse(&state) != 0)
        return 0;

    path_free(&state.path_state);

    global_definition_t* def;
    list_for_each(&state.global_definitions, def) {
        free(def->param);
        free(def);
    }
    list_free_nodes(&state.global_definitions);

    free(state.scope_stack);

    return state.ecl;
}